

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O1

btVector3 __thiscall
btSoftClusterCollisionShape::localGetSupportingVertex
          (btSoftClusterCollisionShape *this,btVector3 *vec)

{
  Node **ppNVar1;
  Node *pNVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  
  ppNVar1 = (this->m_cluster->m_nodes).m_data;
  uVar4 = (ulong)(this->m_cluster->m_nodes).m_size;
  uVar3 = 0;
  if (1 < (long)uVar4) {
    pNVar2 = *ppNVar1;
    fVar6 = (pNVar2->m_x).m_floats[2] * vec->m_floats[2] +
            (pNVar2->m_x).m_floats[0] * vec->m_floats[0] +
            (pNVar2->m_x).m_floats[1] * vec->m_floats[1];
    uVar5 = 1;
    do {
      pNVar2 = ppNVar1[uVar5];
      fVar7 = (pNVar2->m_x).m_floats[2] * vec->m_floats[2] +
              (pNVar2->m_x).m_floats[0] * vec->m_floats[0] +
              (pNVar2->m_x).m_floats[1] * vec->m_floats[1];
      if (fVar6 < fVar7) {
        uVar3 = uVar5 & 0xffffffff;
        fVar6 = fVar7;
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    uVar3 = (ulong)(int)uVar3;
  }
  return (btVector3)*&(ppNVar1[uVar3]->m_x).m_floats;
}

Assistant:

virtual btVector3	localGetSupportingVertex(const btVector3& vec) const
	{
		btSoftBody::Node* const *						n=&m_cluster->m_nodes[0];
		btScalar										d=btDot(vec,n[0]->m_x);
		int												j=0;
		for(int i=1,ni=m_cluster->m_nodes.size();i<ni;++i)
		{
			const btScalar	k=btDot(vec,n[i]->m_x);
			if(k>d) { d=k;j=i; }
		}
		return(n[j]->m_x);
	}